

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O2

void __thiscall adios2::core::ADIOS::ADIOS(ADIOS *this,string *configFile,string *hostLanguage)

{
  Comm CStack_58;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)configFile);
  helper::CommDummy();
  std::__cxx11::string::string((string *)&local_50,(string *)hostLanguage);
  ADIOS(this,&local_30,&CStack_58,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  helper::Comm::~Comm(&CStack_58);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ADIOS::ADIOS(const std::string configFile, const std::string hostLanguage)
: ADIOS(configFile, helper::CommDummy(), hostLanguage)
{
}